

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O1

bool is_limiter(char c)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0;
  do {
    if ((&ninx::lexer::LIMITER_CHARS)[lVar1] == c) {
      return true;
    }
    bVar2 = lVar1 != 0x11;
    lVar1 = lVar1 + 1;
  } while (bVar2);
  return false;
}

Assistant:

bool is_limiter(char c) {
    bool found = false;
    for (char i : ninx::lexer::LIMITER_CHARS) {
        if (i == c) {
            found = true;
            break;
        }
    }
    return found;
}